

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int cram_write_block(cram_fd *fd,cram_block *b)

{
  uint uVar1;
  hFILE *phVar2;
  char *pcVar3;
  byte bVar4;
  byte bVar10;
  cram_block_method c;
  cram_content_type c_00;
  int iVar5;
  undefined4 uVar6;
  uint32_t val;
  int iVar7;
  ulong uVar8;
  long lVar9;
  byte bVar11;
  byte bVar12;
  byte *pbVar13;
  ulong uVar14;
  uchar *puVar15;
  ulong uVar16;
  uchar dat [100];
  undefined1 local_98;
  undefined1 local_97;
  byte local_96 [102];
  
  c = b->method;
  if ((c == RAW) && (b->comp_size != b->uncomp_size)) {
    __assert_fail("b->method != RAW || (b->comp_size == b->uncomp_size)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                  ,0x349,"int cram_write_block(cram_fd *, cram_block *)");
  }
  phVar2 = fd->fp;
  pcVar3 = phVar2->begin;
  if (pcVar3 < phVar2->limit) {
    phVar2->begin = pcVar3 + 1;
    *pcVar3 = (char)c;
  }
  else {
    c = hputc2(c,phVar2);
  }
  iVar7 = -1;
  if (c != ERROR) {
    c_00 = b->content_type;
    phVar2 = fd->fp;
    pcVar3 = phVar2->begin;
    if (pcVar3 < phVar2->limit) {
      phVar2->begin = pcVar3 + 1;
      *pcVar3 = (char)c_00;
    }
    else {
      c_00 = hputc2(c_00,phVar2);
    }
    if ((((c_00 != CT_ERROR) && (iVar5 = itf8_encode(fd,b->content_id), iVar5 != -1)) &&
        (iVar5 = itf8_encode(fd,b->comp_size), iVar5 != -1)) &&
       (iVar5 = itf8_encode(fd,b->uncomp_size), iVar5 != -1)) {
      phVar2 = fd->fp;
      pcVar3 = phVar2->begin;
      uVar14 = (long)phVar2->limit - (long)pcVar3;
      puVar15 = b->data;
      if (b->method == RAW) {
        uVar16 = (ulong)b->uncomp_size;
        uVar8 = uVar16;
        if (uVar14 < uVar16) {
          uVar8 = uVar14;
        }
        memcpy(pcVar3,puVar15,uVar8);
        phVar2->begin = phVar2->begin + uVar8;
        if (uVar14 < uVar16) {
          uVar8 = hwrite2(phVar2,puVar15,uVar16,uVar8);
        }
        if (uVar8 != uVar16) {
          return -1;
        }
      }
      else {
        uVar16 = (ulong)b->comp_size;
        uVar8 = uVar16;
        if (uVar14 < uVar16) {
          uVar8 = uVar14;
        }
        memcpy(pcVar3,puVar15,uVar8);
        phVar2->begin = phVar2->begin + uVar8;
        if (uVar14 < uVar16) {
          uVar8 = hwrite2(phVar2,puVar15,uVar16,uVar8);
        }
        if (uVar8 != uVar16) {
          return -1;
        }
      }
      if (0x2ff < fd->version) {
        local_98 = (undefined1)b->method;
        local_97 = (undefined1)b->content_type;
        uVar1 = b->content_id;
        bVar4 = (byte)uVar1;
        if (uVar1 < 0x80) {
          lVar9 = 1;
          local_96[0] = bVar4;
        }
        else {
          bVar10 = (byte)(uVar1 >> 8);
          if (uVar1 < 0x4000) {
            local_96[0] = bVar10 | 0x80;
            lVar9 = 2;
            local_96[1] = bVar4;
          }
          else {
            local_96[1] = (byte)(uVar1 >> 0x10);
            if (uVar1 < 0x200000) {
              local_96[0] = local_96[1] | 0xc0;
              lVar9 = 3;
              local_96[1] = bVar10;
              local_96[2] = bVar4;
            }
            else {
              local_96[0] = (byte)(uVar1 >> 0x18);
              if (uVar1 < 0x10000000) {
                local_96[0] = local_96[0] | 0xe0;
                lVar9 = 4;
                local_96[2] = bVar10;
                local_96[3] = bVar4;
              }
              else {
                local_96[0] = local_96[0] >> 4 | 0xf0;
                local_96[1] = (byte)(uVar1 >> 0x14);
                local_96[2] = (byte)(uVar1 >> 0xc);
                local_96[3] = (byte)(uVar1 >> 4);
                local_96[4] = bVar4 & 0xf;
                lVar9 = 5;
              }
            }
          }
        }
        pbVar13 = local_96 + lVar9;
        uVar1 = b->comp_size;
        bVar4 = (byte)uVar1;
        if (uVar1 < 0x80) {
          *pbVar13 = bVar4;
          lVar9 = 1;
        }
        else {
          bVar10 = (byte)(uVar1 >> 8);
          if (uVar1 < 0x4000) {
            *pbVar13 = bVar10 | 0x80;
            local_96[lVar9 + 1] = bVar4;
            lVar9 = 2;
          }
          else {
            bVar11 = (byte)(uVar1 >> 0x10);
            if (uVar1 < 0x200000) {
              *pbVar13 = bVar11 | 0xc0;
              local_96[lVar9 + 1] = bVar10;
              local_96[lVar9 + 2] = bVar4;
              lVar9 = 3;
            }
            else {
              bVar12 = (byte)(uVar1 >> 0x18);
              if (uVar1 < 0x10000000) {
                *pbVar13 = bVar12 | 0xe0;
                local_96[lVar9 + 1] = bVar11;
                local_96[lVar9 + 2] = bVar10;
                local_96[lVar9 + 3] = bVar4;
                lVar9 = 4;
              }
              else {
                *pbVar13 = bVar12 >> 4 | 0xf0;
                local_96[lVar9 + 1] = (byte)(uVar1 >> 0x14);
                local_96[lVar9 + 2] = (byte)(uVar1 >> 0xc);
                local_96[lVar9 + 3] = (byte)(uVar1 >> 4);
                local_96[lVar9 + 4] = bVar4 & 0xf;
                lVar9 = 5;
              }
            }
          }
        }
        pbVar13 = pbVar13 + lVar9;
        uVar1 = b->uncomp_size;
        bVar4 = (byte)uVar1;
        if (uVar1 < 0x80) {
          *pbVar13 = bVar4;
          iVar7 = 1;
        }
        else {
          bVar10 = (byte)(uVar1 >> 8);
          if (uVar1 < 0x4000) {
            *pbVar13 = bVar10 | 0x80;
            pbVar13[1] = bVar4;
            iVar7 = 2;
          }
          else {
            bVar11 = (byte)(uVar1 >> 0x10);
            if (uVar1 < 0x200000) {
              *pbVar13 = bVar11 | 0xc0;
              pbVar13[1] = bVar10;
              pbVar13[2] = bVar4;
              iVar7 = 3;
            }
            else {
              bVar12 = (byte)(uVar1 >> 0x18);
              if (uVar1 < 0x10000000) {
                *pbVar13 = bVar12 | 0xe0;
                pbVar13[1] = bVar11;
                pbVar13[2] = bVar10;
                pbVar13[3] = bVar4;
                iVar7 = 4;
              }
              else {
                *pbVar13 = bVar12 >> 4 | 0xf0;
                pbVar13[1] = (byte)(uVar1 >> 0x14);
                pbVar13[2] = (byte)(uVar1 >> 0xc);
                pbVar13[3] = (byte)(uVar1 >> 4);
                pbVar13[4] = bVar4 & 0xf;
                iVar7 = 5;
              }
            }
          }
        }
        uVar6 = crc32(0,&local_98,((int)pbVar13 + iVar7) - (int)&local_98);
        puVar15 = "";
        if (b->data != (uchar *)0x0) {
          puVar15 = b->data;
        }
        val = crc32(uVar6,puVar15,(&b->comp_size)[b->method == RAW]);
        b->crc32 = val;
        iVar7 = int32_encode(fd,val);
        if (iVar7 == -1) {
          return -1;
        }
      }
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int cram_write_block(cram_fd *fd, cram_block *b) {
    assert(b->method != RAW || (b->comp_size == b->uncomp_size));

    if (hputc(b->method,       fd->fp)  == EOF) return -1;
    if (hputc(b->content_type, fd->fp)  == EOF) return -1;
    if (itf8_encode(fd, b->content_id)  ==  -1) return -1;
    if (itf8_encode(fd, b->comp_size)   ==  -1) return -1;
    if (itf8_encode(fd, b->uncomp_size) ==  -1) return -1;

    if (b->method == RAW) {
	if (b->uncomp_size != hwrite(fd->fp, b->data, b->uncomp_size))
	    return -1;
    } else {
	if (b->comp_size != hwrite(fd->fp, b->data, b->comp_size))
	    return -1;
    }

    if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	unsigned char dat[100], *cp = dat;;
	uint32_t crc;

	*cp++ = b->method;
	*cp++ = b->content_type;
	cp += itf8_put(cp, b->content_id);
	cp += itf8_put(cp, b->comp_size);
	cp += itf8_put(cp, b->uncomp_size);
	crc = crc32(0L, dat, cp-dat);

	if (b->method == RAW) {
	    b->crc32 = crc32(crc, b->data ? b->data : (uc*)"", b->uncomp_size);
	} else {
	    b->crc32 = crc32(crc, b->data ? b->data : (uc*)"", b->comp_size);
	}

	if (-1 == int32_encode(fd, b->crc32))
	    return -1;
    }

    return 0;
}